

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardIO.cpp
# Opt level: O3

uint BoardIO::GetFpgaVersionMajorFromStatus(uint32_t status)

{
  if (status == 0) {
    return 1;
  }
  if (-1 < (int)status) {
    return (uint)(0x3fffffff < status) * 3;
  }
  return 2;
}

Assistant:

unsigned int BoardIO::GetFpgaVersionMajorFromStatus(uint32_t status)
{
    // FPGA V1:  all bits are 0
    // FPGA V2:  bit 31 is 1
    // FPGA V3:  bits[31:30] are 01
    unsigned int fpga_ver = 0;
    if (status == 0)
        fpga_ver = 1;
    else if (status&0x80000000)
        fpga_ver = 2;
    else if ((status&0x40000000) == 0x40000000)
        fpga_ver = 3;

    return fpga_ver;
}